

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O2

void __thiscall CCheckQueue<CScriptCheck>::~CCheckQueue(CCheckQueue<CScriptCheck> *this)

{
  pointer ptVar1;
  thread *t;
  pointer ptVar2;
  long in_FS_OFFSET;
  anon_class_8_1_8991fb9c local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.this = this;
  ~CCheckQueue::anon_class_8_1_8991fb9c::operator()(&local_38);
  std::condition_variable::notify_all();
  ptVar1 = (this->m_worker_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->m_worker_threads).
                super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->m_worker_threads);
  std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector(&this->queue);
  std::condition_variable::~condition_variable(&this->m_master_cv);
  std::condition_variable::~condition_variable(&this->m_worker_cv);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~CCheckQueue()
    {
        WITH_LOCK(m_mutex, m_request_stop = true);
        m_worker_cv.notify_all();
        for (std::thread& t : m_worker_threads) {
            t.join();
        }
    }